

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O3

Abc_Obj_t * Abc_NtkBddDecompose(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNode,int nLutSize,int fVerbose)

{
  int iVar1;
  DdManager *dd;
  void **ppvVar2;
  int *piVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  Vec_Ptr_t *vCofs;
  Vec_Ptr_t *vUniq;
  void **__dest;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  Abc_Obj_t *pCofs [20];
  Abc_Obj_t *local_d8;
  undefined8 local_d0;
  undefined8 auStack_c8 [19];
  
  iVar1 = (pNode->vFanins).nSize;
  if (iVar1 <= nLutSize) {
    __assert_fail("Abc_ObjFaninNum(pNode) > nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                  ,0x253,"Abc_Obj_t *Abc_NtkBddDecompose(Abc_Ntk_t *, Abc_Obj_t *, int, int)");
  }
  dd = (DdManager *)pNode->pNtk->pManFunc;
  if ((iVar1 == nLutSize + 1) &&
     (pAVar5 = Abc_NtkBddFindCofactor(pNtkNew,pNode,nLutSize), pAVar5 != (Abc_Obj_t *)0x0)) {
    if (fVerbose != 0) {
      printf("Decomposing %d-input node %d using MUX.\n",(ulong)(uint)(pNode->vFanins).nSize,
             (ulong)(uint)pNode->Id);
    }
  }
  else {
    vCofs = Abc_NtkBddCofactors(dd,(DdNode *)(pNode->field_5).pData,nLutSize);
    vUniq = (Vec_Ptr_t *)malloc(0x10);
    uVar4 = vCofs->nSize;
    uVar8 = (ulong)uVar4;
    vUniq->nSize = uVar4;
    iVar1 = vCofs->nCap;
    vUniq->nCap = iVar1;
    if ((long)iVar1 == 0) {
      __dest = (void **)0x0;
    }
    else {
      __dest = (void **)malloc((long)iVar1 << 3);
    }
    vUniq->pArray = __dest;
    ppvVar2 = vCofs->pArray;
    memcpy(__dest,ppvVar2,(long)(int)uVar4 * 8);
    if (1 < (int)uVar4) {
      qsort(__dest,uVar8,8,Vec_PtrSortCompare);
      uVar4 = 1;
      uVar6 = 1;
      do {
        if (__dest[uVar6] != __dest[uVar6 - 1]) {
          lVar7 = (long)(int)uVar4;
          uVar4 = uVar4 + 1;
          __dest[lVar7] = __dest[uVar6];
        }
        uVar6 = uVar6 + 1;
      } while (uVar8 != uVar6);
      vUniq->nSize = uVar4;
    }
    if (1 << ((char)nLutSize - 2U & 0x1f) < (int)uVar4) {
      if (ppvVar2 != (void **)0x0) {
        free(ppvVar2);
      }
      free(vCofs);
      vCofs = Abc_NtkBddCofactors(dd,(DdNode *)(pNode->field_5).pData,2);
      if (fVerbose == 0) {
        uVar4 = vCofs->nSize;
      }
      else {
        uVar4 = vCofs->nSize;
        printf("Decomposing %d-input node %d using cofactoring with %d cofactors.\n",
               (ulong)(uint)(pNode->vFanins).nSize,(ulong)(uint)pNode->Id,(ulong)uVar4);
      }
      piVar3 = (pNode->vFanins).pArray;
      ppvVar2 = pNode->pNtk->vObjs->pArray;
      local_d8 = *(Abc_Obj_t **)((long)ppvVar2[*piVar3] + 0x40);
      local_d0 = *(undefined8 *)((long)ppvVar2[piVar3[1]] + 0x40);
      if (0 < (int)uVar4) {
        ppvVar2 = vCofs->pArray;
        uVar8 = 0;
        do {
          pAVar5 = Abc_NtkCreateCofLut(pNtkNew,dd,(DdNode *)ppvVar2[uVar8],pNode,2);
          auStack_c8[uVar8] = pAVar5;
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      if (nLutSize == 6) {
        pAVar5 = Abc_NtkBddMux411(pNtkNew,&local_d8);
      }
      else if (nLutSize == 5) {
        pAVar5 = Abc_NtkBddMux412a(pNtkNew,&local_d8);
      }
      else {
        if (nLutSize != 4) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLutmin.c"
                        ,0x279,"Abc_Obj_t *Abc_NtkBddDecompose(Abc_Ntk_t *, Abc_Obj_t *, int, int)")
          ;
        }
        pAVar5 = Abc_NtkBddMux412(pNtkNew,&local_d8);
      }
    }
    else {
      if (fVerbose != 0) {
        printf("Decomposing %d-input node %d using Curtis with %d unique columns.\n",
               (ulong)(uint)(pNode->vFanins).nSize,(ulong)(uint)pNode->Id,(ulong)uVar4);
      }
      pAVar5 = Abc_NtkBddCurtis(pNtkNew,pNode,vCofs,vUniq);
    }
    if (vCofs->pArray != (void **)0x0) {
      free(vCofs->pArray);
    }
    free(vCofs);
    if (__dest != (void **)0x0) {
      free(__dest);
    }
    free(vUniq);
  }
  return pAVar5;
}

Assistant:

Abc_Obj_t * Abc_NtkBddDecompose( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNode, int nLutSize, int fVerbose )
{
    Vec_Ptr_t * vCofs, * vUniq;
    DdManager * dd = (DdManager *)pNode->pNtk->pManFunc;
    DdNode * bCof;
    Abc_Obj_t * pNodeNew = NULL;
    Abc_Obj_t * pCofs[20];
    int i;
    assert( Abc_ObjFaninNum(pNode) > nLutSize );
    // try to decompose with two LUTs (the best case for Supp = LutSize + 1)
    if ( Abc_ObjFaninNum(pNode) == nLutSize + 1 )
    {

        pNodeNew = Abc_NtkBddFindCofactor( pNtkNew, pNode, nLutSize );
        if ( pNodeNew != NULL )
        {
            if ( fVerbose )
            printf( "Decomposing %d-input node %d using MUX.\n",
                Abc_ObjFaninNum(pNode), Abc_ObjId(pNode) );
            return pNodeNew;
        }

    }
    // cofactor w.r.t. the bound set variables
    vCofs = Abc_NtkBddCofactors( dd, (DdNode *)pNode->pData, nLutSize );
    vUniq = Vec_PtrDup( vCofs );
    Vec_PtrUniqify( vUniq, (int (*)())Vec_PtrSortCompare );
    // only perform decomposition with it is support reduring with two less vars
    if( Vec_PtrSize(vUniq) > (1 << (nLutSize-2)) )
    {
        Vec_PtrFree( vCofs );
        vCofs = Abc_NtkBddCofactors( dd, (DdNode *)pNode->pData, 2 );
        if ( fVerbose )
        printf( "Decomposing %d-input node %d using cofactoring with %d cofactors.\n",
            Abc_ObjFaninNum(pNode), Abc_ObjId(pNode), Vec_PtrSize(vCofs) );
        // implement the cofactors
        pCofs[0] = Abc_ObjFanin(pNode, 0)->pCopy;
        pCofs[1] = Abc_ObjFanin(pNode, 1)->pCopy;
        Vec_PtrForEachEntry( DdNode *, vCofs, bCof, i )
            pCofs[2+i] = Abc_NtkCreateCofLut( pNtkNew, dd, bCof, pNode, 2 );
        if ( nLutSize == 4 )
            pNodeNew = Abc_NtkBddMux412( pNtkNew, pCofs );
        else if ( nLutSize == 5 )
            pNodeNew = Abc_NtkBddMux412a( pNtkNew, pCofs );
        else if ( nLutSize == 6 )
            pNodeNew = Abc_NtkBddMux411( pNtkNew, pCofs );
        else  assert( 0 );
    }
    // alternative decompose using MUX-decomposition
    else
    {
        if ( fVerbose )
        printf( "Decomposing %d-input node %d using Curtis with %d unique columns.\n",
            Abc_ObjFaninNum(pNode), Abc_ObjId(pNode), Vec_PtrSize(vUniq) );
        pNodeNew = Abc_NtkBddCurtis( pNtkNew, pNode, vCofs, vUniq );
    }
    Vec_PtrFree( vCofs );
    Vec_PtrFree( vUniq );
    return pNodeNew;
}